

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall
cmCTestRunTest::ForkProcess
          (cmCTestRunTest *this,double testTimeOut,bool explicitTimeout,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment)

{
  char *__s;
  char *pcVar1;
  cmCTest *this_00;
  bool bVar2;
  cmProcess *this_01;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  ulong uVar6;
  double dVar7;
  undefined8 uVar8;
  SaveRestoreEnvironment sre;
  long *local_1d8;
  long local_1c8 [2];
  ulong local_1b8;
  undefined8 uStack_1b0;
  SaveRestoreEnvironment local_1a8 [3];
  ios_base local_138 [264];
  
  this_01 = (cmProcess *)operator_new(0xc0);
  cmProcess::cmProcess(this_01);
  this->TestProcess = this_01;
  this_01->Id = this->Index;
  __s = (this->TestProperties->Directory)._M_dataplus._M_p;
  pcVar1 = (char *)(this_01->WorkingDirectory)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this_01->WorkingDirectory,0,pcVar1,(ulong)__s);
  cmProcess::SetCommand(this->TestProcess,(this->ActualCommand)._M_dataplus._M_p);
  cmProcess::SetCommandArguments(this->TestProcess,&this->Arguments);
  dVar4 = cmCTest::GetRemainingTimeAllowed(this->CTest);
  dVar4 = dVar4 + -120.0;
  dVar7 = this->CTest->TimeOut;
  dVar5 = dVar7;
  if (dVar4 <= dVar7) {
    dVar5 = dVar4;
  }
  dVar7 = (double)(~-(ulong)(0.0 < dVar7) & (ulong)dVar4 | (ulong)dVar5 & -(ulong)(0.0 < dVar7));
  uVar8 = extraout_XMM0_Qb;
  if (0.0 < testTimeOut) {
    dVar5 = cmCTest::GetRemainingTimeAllowed(this->CTest);
    uVar8 = extraout_XMM0_Qb;
    if (testTimeOut < dVar5) {
      dVar7 = testTimeOut;
      uVar8 = in_XMM0_Qb;
    }
  }
  uVar6 = ~-(ulong)(0.0 < dVar7) & 0x3ff0000000000000 | (ulong)dVar7 & -(ulong)(0.0 < dVar7);
  local_1b8 = 0;
  uStack_1b0 = 0;
  if (!explicitTimeout) {
    local_1b8 = uVar6;
    uStack_1b0 = uVar8;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Test timeout computed to be: ",0x1d);
  dVar7 = (double)(-(ulong)(testTimeOut == 0.0) & local_1b8 | ~-(ulong)(testTimeOut == 0.0) & uVar6)
  ;
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2d0,(char *)local_1d8,(this->TestHandler->super_cmCTestGenericHandler).Quiet);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  this->TestProcess->Timeout = dVar7;
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(local_1a8);
  if ((environment !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) &&
     ((environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    cmSystemTools::AppendEnv(environment);
  }
  bVar2 = cmProcess::StartProcess(this->TestProcess);
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(local_1a8);
  return bVar2;
}

Assistant:

bool cmCTestRunTest::ForkProcess(double testTimeOut, bool explicitTimeout,
                     std::vector<std::string>* environment)
{
  this->TestProcess = new cmProcess;
  this->TestProcess->SetId(this->Index);
  this->TestProcess->SetWorkingDirectory(
        this->TestProperties->Directory.c_str());
  this->TestProcess->SetCommand(this->ActualCommand.c_str());
  this->TestProcess->SetCommandArguments(this->Arguments);

  // determine how much time we have
  double timeout = this->CTest->GetRemainingTimeAllowed() - 120;
  if (this->CTest->GetTimeOut() > 0 && this->CTest->GetTimeOut() < timeout)
    {
    timeout = this->CTest->GetTimeOut();
    }
  if (testTimeOut > 0
      && testTimeOut < this->CTest->GetRemainingTimeAllowed())
    {
    timeout = testTimeOut;
    }
  // always have at least 1 second if we got to here
  if (timeout <= 0)
    {
    timeout = 1;
    }
  // handle timeout explicitly set to 0
  if (testTimeOut == 0 && explicitTimeout)
    {
    timeout = 0;
    }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ": "
    << "Test timeout computed to be: " << timeout << "\n",
    this->TestHandler->GetQuiet());

  this->TestProcess->SetTimeout(timeout);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmSystemTools::SaveRestoreEnvironment sre;
#endif

  if (environment && !environment->empty())
    {
    cmSystemTools::AppendEnv(*environment);
    }

  return this->TestProcess->StartProcess();
}